

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_time.c
# Opt level: O1

int pt_time_query_cbr(uint32_t *cbr,pt_time *time)

{
  int iVar1;
  
  iVar1 = -1;
  if ((time != (pt_time *)0x0 && cbr != (uint32_t *)0x0) &&
     (iVar1 = -0x10, (time->field_0x29 & 2) != 0)) {
    *cbr = (uint)time->cbr;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int pt_time_query_cbr(uint32_t *cbr, const struct pt_time *time)
{
	if (!cbr || !time)
		return -pte_internal;

	if (!time->have_cbr)
		return -pte_no_cbr;

	*cbr = time->cbr;

	return 0;
}